

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Minisat::Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::insert
          (Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_> *this,int k)

{
  int local_18;
  int local_14;
  
  _local_18 = CONCAT44(0xffffffff,k);
  vec<int,_int>::growTo(&(this->indices).map,k + 1,&local_14);
  if ((local_18 < (this->indices).map.sz) && (-1 < (this->indices).map.data[local_18])) {
    __assert_fail("!inHeap(k)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/Heap.h"
                  ,0x66,
                  "void Minisat::Heap<int, Minisat::SimpSolver::ElimLt>::insert(K) [K = int, Comp = Minisat::SimpSolver::ElimLt, MkIndex = Minisat::MkIndexDefault<int>]"
                 );
  }
  if (local_18 < (this->indices).map.sz) {
    (this->indices).map.data[local_18] = (this->heap).sz;
    vec<int,_int>::push(&this->heap,&local_18);
    if (local_18 < (this->indices).map.sz) {
      percolateUp(this,(this->indices).map.data[local_18]);
      return;
    }
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, int>::operator[](K) [K = int, V = int, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

void insert(K k)
    {
        indices.reserve(k, -1);
        assert(!inHeap(k));

        indices[k] = heap.size();
        heap.push(k);
        percolateUp(indices[k]);
    }